

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

int32_t ucnv_toUCountPending_63(UConverter *cnv,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  UConverter *cnv_local;
  
  if ((status == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    return -1;
  }
  if (cnv == (UConverter *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
  }
  if ('\0' < cnv->preToULength) {
    return (int)cnv->preToULength;
  }
  if (cnv->preToULength < '\0') {
    return -(int)cnv->preToULength;
  }
  if ('\0' < cnv->toULength) {
    return (int)cnv->toULength;
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_toUCountPending(const UConverter* cnv, UErrorCode* status){

    if(status == NULL || U_FAILURE(*status)){
        return -1;
    }
    if(cnv == NULL){
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return -1;
    }

    if(cnv->preToULength > 0){
        return cnv->preToULength ;
    }else if(cnv->preToULength < 0){
        return -cnv->preToULength;
    }else if(cnv->toULength > 0){
        return cnv->toULength;
    }
    return 0;
}